

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O1

Quat4f __thiscall Quat4f::slerp(Quat4f *this,Quat4f *a,Quat4f *b,float t,bool allowFlip)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Quat4f QVar10;
  
  fVar8 = a->m_elements[3] * b->m_elements[3] +
          a->m_elements[2] * b->m_elements[2] +
          a->m_elements[0] * b->m_elements[0] + a->m_elements[1] * b->m_elements[1];
  dVar3 = (double)ABS(fVar8);
  if (0.009999999776482582 <= 1.0 - dVar3) {
    dVar3 = acos(dVar3);
    fVar6 = (float)dVar3;
    dVar3 = sin((double)fVar6);
    dVar4 = sin((double)((1.0 - t) * fVar6));
    fVar7 = (float)(dVar4 / (double)(float)dVar3);
    dVar4 = sin((double)(fVar6 * t));
    t = (float)(dVar4 / (double)(float)dVar3);
  }
  else {
    fVar7 = 1.0 - t;
  }
  fVar6 = fVar7;
  if (allowFlip) {
    fVar6 = -fVar7;
  }
  uVar5 = -(uint)(fVar8 < 0.0);
  fVar9 = (float)(~uVar5 & (uint)fVar7 | (uint)fVar6 & uVar5);
  QVar10.m_elements[2] = a->m_elements[0] * fVar9 + b->m_elements[0] * t;
  fVar8 = b->m_elements[1];
  fVar6 = a->m_elements[1];
  QVar10.m_elements[0] = b->m_elements[2] * t;
  fVar7 = a->m_elements[2];
  fVar1 = b->m_elements[3];
  fVar2 = a->m_elements[3];
  this->m_elements[0] = QVar10.m_elements[2];
  this->m_elements[1] = fVar6 * fVar9 + fVar8 * t;
  this->m_elements[2] = fVar7 * fVar9 + QVar10.m_elements[0];
  this->m_elements[3] = fVar9 * fVar2 + t * fVar1;
  QVar10.m_elements[1] = 0.0;
  QVar10.m_elements[3] = 0.0;
  return (Quat4f)QVar10.m_elements;
}

Assistant:

Quat4f Quat4f::slerp( const Quat4f& a, const Quat4f& b, float t, bool allowFlip )
{
	float cosAngle = Quat4f::dot( a, b );

	float c1;
	float c2;

	// Linear interpolation for close orientations
	if( ( 1.0f - fabs( cosAngle ) ) < 0.01f )
	{
		c1 = 1.0f - t;
		c2 = t;
	}
	else
	{
		// Spherical interpolation
		float angle = acos( fabs( cosAngle ) );
		float sinAngle = sin( angle );
		c1 = sin( angle * ( 1.0f - t ) ) / sinAngle;
		c2 = sin( angle * t ) / sinAngle;
	}

	// Use the shortest path
	if( allowFlip && ( cosAngle < 0.0f ) )
	{
		c1 = -c1;
	}

	return Quat4f( c1 * a[ 0 ] + c2 * b[ 0 ], c1 * a[ 1 ] + c2 * b[ 1 ], c1 * a[ 2 ] + c2 * b[ 2 ], c1 * a[ 3 ] + c2 * b[ 3 ] );
}